

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeExV(void *ptr_id,ImGuiTreeNodeFlags flags,char *fmt,__va_list_tag *args)

{
  int iVar1;
  ImGuiWindow *buf_size;
  char *in_RCX;
  char *label_end;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *in_stack_00000128;
  char *in_stack_00000130;
  ImGuiTreeNodeFlags in_stack_0000013c;
  ImGuiID in_stack_00000140;
  char *ptr;
  __va_list_tag *in_stack_ffffffffffffffc0;
  bool local_1;
  
  buf_size = GetCurrentWindow();
  if ((buf_size->SkipItems & 1U) == 0) {
    ptr = GImGui->TempBuffer;
    iVar1 = ImFormatStringV(in_RCX,(size_t)buf_size,&GImGui->Initialized,in_stack_ffffffffffffffc0);
    ImGuiWindow::GetID((ImGuiWindow *)(ptr + iVar1),ptr);
    local_1 = TreeNodeBehavior(in_stack_00000140,in_stack_0000013c,in_stack_00000130,
                               in_stack_00000128);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::TreeNodeExV(const void* ptr_id, ImGuiTreeNodeFlags flags, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const char* label_end = g.TempBuffer + ImFormatStringV(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), fmt, args);
    return TreeNodeBehavior(window->GetID(ptr_id), flags, g.TempBuffer, label_end);
}